

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStackInfix.cpp
# Opt level: O2

void __thiscall Imaginer::Utils::iStackInfix::~iStackInfix(iStackInfix *this)

{
  if (this->_sign != (OPERATE *)0x0) {
    free(this->_sign);
    this->_sign = (OPERATE *)0x0;
  }
  if (this->_number != (OPERAND *)0x0) {
    free(this->_number);
    this->_number = (OPERAND *)0x0;
  }
  return;
}

Assistant:

iStackInfix::~iStackInfix()
{
    if(_sign)
    {
        free(_sign);
        _sign = NULL;
    }
    if(_number)
    {
        free(_number);
        _number = NULL;
    }
}